

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

example * VW::new_unused_example(vw *all)

{
  uint64_t *puVar1;
  parser *ppVar2;
  example *peVar3;
  
  ppVar2 = all->p;
  peVar3 = object_pool<example,_example_initializer>::get_object(&ppVar2->example_pool);
  peVar3->in_use = true;
  puVar1 = &ppVar2->begin_parsed_examples;
  *puVar1 = *puVar1 + 1;
  (*(all->p->lp).default_label)(&peVar3->l);
  puVar1 = &all->p->begin_parsed_examples;
  *puVar1 = *puVar1 + 1;
  peVar3->example_counter = all->p->begin_parsed_examples;
  return peVar3;
}

Assistant:

example* new_unused_example(vw& all)
{
  example* ec = &get_unused_example(&all);
  all.p->lp.default_label(&ec->l);
  all.p->begin_parsed_examples++;
  ec->example_counter = (size_t)all.p->begin_parsed_examples;
  return ec;
}